

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_setNodeName(IXML_Node *node,char *qualifiedName)

{
  char *pcVar1;
  int local_24;
  int rc;
  char *qualifiedName_local;
  IXML_Node *node_local;
  
  local_24 = 0;
  if (node == (IXML_Node *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                  0x551,"int ixmlNode_setNodeName(IXML_Node *, const char *)");
  }
  if (node->nodeName != (char *)0x0) {
    free(node->nodeName);
    node->nodeName = (char *)0x0;
  }
  if (qualifiedName != (char *)0x0) {
    pcVar1 = strdup(qualifiedName);
    node->nodeName = pcVar1;
    if (node->nodeName == (char *)0x0) {
      return 0x66;
    }
    local_24 = Parser_setNodePrefixAndLocalName(node);
    if (local_24 != 0) {
      free(node->nodeName);
    }
  }
  return local_24;
}

Assistant:

int ixmlNode_setNodeName(IXML_Node *node, const DOMString qualifiedName)
{
	int rc = IXML_SUCCESS;

	assert(node != NULL);

	if (node->nodeName != NULL) {
		free(node->nodeName);
		node->nodeName = NULL;
	}

	if (qualifiedName != NULL) {
		/* set the name part */
		node->nodeName = strdup(qualifiedName);
		if (node->nodeName == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}

		rc = Parser_setNodePrefixAndLocalName(node);
		if (rc != IXML_SUCCESS) {
			free(node->nodeName);
		}
	}

	return rc;
}